

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::EqualElement<char_const*>::operator()
          (void *this,basic_string_view<char,_std::char_traits<char>_> *lhs,
          basic_string_view<char,_std::char_traits<char>_> *param_2)

{
  size_t __n;
  char *__s1;
  char *__s;
  int iVar1;
  size_t sVar2;
  size_type __rlen;
  bool bVar3;
  
  __n = lhs->_M_len;
  __s1 = lhs->_M_str;
  __s = (char *)**this;
  sVar2 = strlen(__s);
  if (__n == sVar2) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp(__s1,__s,__n);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator()(const K2& lhs, Args&&...) const {
      return eq(lhs, rhs);
    }